

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O3

Cnf_Dat_t * Cnf_ManWriteCnf(Cnf_Man_t *p,Vec_Ptr_t *vMapped,int nOutputs)

{
  void **ppvVar1;
  char cVar2;
  ushort uVar3;
  int iVar4;
  void **ppvVar5;
  char *pcVar6;
  void *pvVar7;
  int iVar8;
  long lVar9;
  Cnf_Dat_t *pCVar10;
  int **ppiVar11;
  int *piVar12;
  Vec_Int_t *pVVar13;
  int *piVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  Vec_Int_t *pVVar19;
  uint uVar20;
  long lVar21;
  Vec_Ptr_t *pVVar22;
  int iVar23;
  ulong uVar24;
  Aig_Man_t *pAVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int pVars [32];
  int local_b8 [34];
  
  pAVar25 = p->pManAig;
  iVar4 = pAVar25->nObjs[3];
  iVar29 = iVar4 + 1 + nOutputs * 3;
  iVar28 = iVar4 + nOutputs + 1;
  iVar8 = vMapped->nSize;
  lVar9 = (long)iVar8;
  if (0 < lVar9) {
    ppvVar5 = vMapped->pArray;
    lVar18 = 0;
    do {
      if ((*(uint *)((long)ppvVar5[lVar18] + 0x18) & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                      ,0xd7,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
      }
      pcVar6 = *(char **)((long)ppvVar5[lVar18] + 0x28);
      cVar2 = *pcVar6;
      if ((long)cVar2 < 5) {
        uVar3 = *(ushort *)(pcVar6 + (long)cVar2 * 4 + 0x18);
        cVar2 = p->pSopSizes[uVar3];
        lVar16 = (long)cVar2;
        if (lVar16 < 1) {
          if (cVar2 < '\0') {
            __assert_fail("p->pSopSizes[uTruth] >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                          ,0xdf,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
          }
          iVar23 = iVar29 + cVar2;
          lVar16 = 0;
        }
        else {
          lVar26 = 0;
          iVar23 = 0;
          do {
            iVar27 = 4;
            iVar15 = (int)p->pSops[uVar3][lVar26];
            do {
              iVar23 = iVar23 + (uint)(iVar15 % 3 != 2);
              iVar27 = iVar27 + -1;
              iVar15 = iVar15 / 3;
            } while (iVar27 != 0);
            lVar26 = lVar26 + 1;
          } while (lVar26 != lVar16);
          iVar23 = iVar29 + cVar2 + iVar23;
        }
        cVar2 = p->pSopSizes[(ulong)uVar3 ^ 0xffff];
        uVar17 = (ulong)cVar2;
        if ((long)uVar17 < 1) {
          iVar29 = 0;
        }
        else {
          uVar24 = 0;
          iVar29 = 0;
          do {
            iVar27 = 4;
            iVar15 = (int)p->pSops[(ulong)uVar3 ^ 0xffff][uVar24];
            do {
              iVar29 = iVar29 + (uint)(iVar15 % 3 != 2);
              iVar27 = iVar27 + -1;
              iVar15 = iVar15 / 3;
            } while (iVar27 != 0);
            uVar24 = uVar24 + 1;
          } while (uVar24 != uVar17);
        }
        if (cVar2 < '\0') {
          __assert_fail("p->pSopSizes[uTruth] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                        ,0xec,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
        }
        iVar15 = (int)lVar16;
        iVar29 = iVar29 + cVar2;
      }
      else {
        pVVar13 = *(Vec_Int_t **)(pcVar6 + 0x10);
        iVar23 = Cnf_IsopCountLiterals(pVVar13,(int)cVar2);
        iVar15 = pVVar13->nSize;
        iVar23 = iVar23 + iVar29 + iVar15;
        pVVar13 = *(Vec_Int_t **)(pcVar6 + 8);
        iVar29 = Cnf_IsopCountLiterals(pVVar13,(int)cVar2);
        uVar20 = pVVar13->nSize;
        uVar17 = (ulong)uVar20;
        iVar29 = iVar29 + uVar20;
      }
      iVar29 = iVar23 + iVar29;
      iVar28 = iVar28 + iVar15 + (int)uVar17;
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar9);
  }
  pCVar10 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar10->pMan = pAVar25;
  pCVar10->nLiterals = iVar29;
  pCVar10->nClauses = iVar28;
  lVar18 = (long)iVar28;
  ppiVar11 = (int **)malloc(lVar18 * 8 + 8);
  pCVar10->pClauses = ppiVar11;
  lVar16 = (long)iVar29;
  piVar12 = (int *)malloc(lVar16 * 4);
  *ppiVar11 = piVar12;
  ppiVar11[lVar18] = piVar12 + lVar16;
  pVVar22 = pAVar25->vObjs;
  lVar26 = (long)pVVar22->nSize;
  piVar12 = (int *)malloc(lVar26 * 4);
  pCVar10->pVarNums = piVar12;
  if (0 < lVar26) {
    lVar26 = 0;
    do {
      piVar12[lVar26] = -1;
      lVar26 = lVar26 + 1;
    } while (lVar26 < pVVar22->nSize);
  }
  iVar29 = 1;
  if (nOutputs != 0) {
    if (pAVar25->nRegs == 0) {
      if (iVar4 != nOutputs) {
        __assert_fail("nOutputs == Aig_ManCoNum(p->pManAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                      ,0x10e,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
      }
      pVVar22 = pAVar25->vCos;
      if (0 < pVVar22->nSize) {
        ppvVar5 = pVVar22->pArray;
        lVar26 = 0;
        do {
          ppvVar1 = ppvVar5 + lVar26;
          lVar26 = lVar26 + 1;
          piVar12[*(int *)((long)*ppvVar1 + 0x24)] = (int)lVar26;
        } while (lVar26 < pVVar22->nSize);
        iVar29 = (int)lVar26 + 1;
      }
    }
    else {
      if (pAVar25->nRegs != nOutputs) {
        __assert_fail("nOutputs == Aig_ManRegNum(p->pManAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                      ,0x114,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
      }
      uVar20 = iVar4 - nOutputs;
      uVar17 = (ulong)uVar20;
      pVVar22 = pAVar25->vCos;
      if ((int)uVar20 < pVVar22->nSize) {
        iVar29 = 1;
        do {
          if ((int)uVar20 < 0) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          piVar12[*(int *)((long)pVVar22->pArray[uVar17] + 0x24)] = iVar29;
          iVar29 = iVar29 + 1;
          uVar17 = uVar17 + 1;
        } while ((int)uVar17 < pVVar22->nSize);
      }
    }
  }
  if (0 < iVar8) {
    ppvVar5 = vMapped->pArray;
    lVar26 = 0;
    do {
      piVar12[*(int *)((long)ppvVar5[lVar26] + 0x24)] = iVar29 + (int)lVar26;
      lVar26 = lVar26 + 1;
    } while (lVar9 != lVar26);
    iVar29 = iVar29 + (int)lVar26;
  }
  pVVar22 = pAVar25->vCis;
  if (0 < pVVar22->nSize) {
    ppvVar5 = pVVar22->pArray;
    lVar9 = 0;
    do {
      piVar12[*(int *)((long)ppvVar5[lVar9] + 0x24)] = iVar29 + (int)lVar9;
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar22->nSize);
    iVar29 = iVar29 + (int)lVar9;
  }
  piVar12[pAVar25->pConst1->Id] = iVar29;
  pCVar10->nVars = iVar29 + 1;
  pVVar13 = (Vec_Int_t *)malloc(0x10);
  pVVar13->nCap = 0x10000;
  pVVar13->nSize = 0;
  piVar14 = (int *)malloc(0x40000);
  pVVar13->pArray = piVar14;
  piVar12 = *ppiVar11;
  if (0 < iVar8) {
    lVar9 = 0;
    do {
      pcVar6 = *(char **)((long)vMapped->pArray[lVar9] + 0x28);
      piVar14 = pCVar10->pVarNums;
      iVar4 = piVar14[*(int *)((long)vMapped->pArray[lVar9] + 0x24)];
      cVar2 = *pcVar6;
      lVar26 = (long)cVar2;
      if (lVar26 < 1) {
LAB_00560262:
        Cnf_SopConvertToVector
                  (p->pSops[*(ushort *)(pcVar6 + lVar26 * 4 + 0x18)],
                   (int)p->pSopSizes[*(ushort *)(pcVar6 + lVar26 * 4 + 0x18)],pVVar13);
        pVVar19 = pVVar13;
      }
      else {
        iVar8 = p->pManAig->vObjs->nSize;
        lVar21 = 0;
        do {
          iVar29 = piVar14[*(int *)(pcVar6 + lVar21 * 4 + 0x18)];
          local_b8[lVar21] = iVar29;
          if (iVar8 < iVar29) {
            __assert_fail("pVars[k] <= Aig_ManObjNumMax(p->pManAig)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                          ,0x14d,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
          }
          lVar21 = lVar21 + 1;
        } while (lVar26 != lVar21);
        if (cVar2 < '\x05') goto LAB_00560262;
        pVVar19 = *(Vec_Int_t **)(pcVar6 + 0x10);
      }
      if (0 < pVVar19->nSize) {
        lVar26 = 0;
        lVar21 = 0;
        do {
          iVar8 = pVVar19->pArray[lVar21];
          ppiVar11[lVar21] = piVar12;
          *piVar12 = iVar4 * 2;
          iVar8 = Cnf_IsopWriteCube(iVar8,(int)*pcVar6,local_b8,piVar12 + 1);
          piVar12 = piVar12 + (long)iVar8 + 1;
          lVar21 = lVar21 + 1;
          lVar26 = lVar26 + 8;
        } while (lVar21 < pVVar19->nSize);
        ppiVar11 = (int **)((long)ppiVar11 + lVar26);
      }
      if ((long)*pcVar6 < 5) {
        Cnf_SopConvertToVector
                  (p->pSops[*(ushort *)(pcVar6 + (long)*pcVar6 * 4 + 0x18) ^ 0xffff],
                   (int)p->pSopSizes[*(ushort *)(pcVar6 + (long)*pcVar6 * 4 + 0x18) ^ 0xffff],
                   pVVar13);
        pVVar19 = pVVar13;
      }
      else {
        pVVar19 = *(Vec_Int_t **)(pcVar6 + 8);
      }
      if (0 < pVVar19->nSize) {
        lVar26 = 0;
        lVar21 = 0;
        do {
          iVar8 = pVVar19->pArray[lVar21];
          ppiVar11[lVar21] = piVar12;
          *piVar12 = iVar4 * 2 + 1;
          iVar8 = Cnf_IsopWriteCube(iVar8,(int)*pcVar6,local_b8,piVar12 + 1);
          piVar12 = piVar12 + (long)iVar8 + 1;
          lVar21 = lVar21 + 1;
          lVar26 = lVar26 + 8;
        } while (lVar21 < pVVar19->nSize);
        ppiVar11 = (int **)((long)ppiVar11 + lVar26);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < vMapped->nSize);
    piVar14 = pVVar13->pArray;
  }
  if (piVar14 != (int *)0x0) {
    free(piVar14);
  }
  free(pVVar13);
  iVar4 = pCVar10->pVarNums[p->pManAig->pConst1->Id];
  if (p->pManAig->vObjs->nSize < iVar4) {
    __assert_fail("OutVar <= Aig_ManObjNumMax(p->pManAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                  ,0x174,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
  }
  *ppiVar11 = piVar12;
  ppiVar11 = ppiVar11 + 1;
  *piVar12 = iVar4 * 2;
  piVar12 = piVar12 + 1;
  pAVar25 = p->pManAig;
  pVVar22 = pAVar25->vCos;
  if (0 < pVVar22->nSize) {
    lVar9 = 0;
    piVar14 = piVar12;
    do {
      pvVar7 = pVVar22->pArray[lVar9];
      iVar4 = pCVar10->pVarNums
              [*(int *)((*(ulong *)((long)pvVar7 + 8) & 0xfffffffffffffffe) + 0x24)];
      if (lVar9 < (long)pAVar25->nObjs[3] - (long)nOutputs) {
        piVar12 = piVar14 + 1;
        *ppiVar11 = piVar14;
        ppiVar11 = ppiVar11 + 1;
        iVar8 = (*(uint *)((long)pvVar7 + 8) & 1) + iVar4 * 2;
      }
      else {
        iVar29 = pCVar10->pVarNums[*(int *)((long)pvVar7 + 0x24)];
        *ppiVar11 = piVar14;
        piVar14[1] = (*(uint *)((long)pvVar7 + 8) & 1) + iVar4 * 2 ^ 1;
        ppiVar11[1] = piVar14 + 2;
        ppiVar11 = ppiVar11 + 2;
        iVar8 = iVar29 * 2;
        piVar14[2] = iVar29 * 2 + 1;
        piVar12 = piVar14 + 4;
        piVar14[3] = (*(uint *)((long)pvVar7 + 8) & 1) + iVar4 * 2;
      }
      *piVar14 = iVar8;
      lVar9 = lVar9 + 1;
      pAVar25 = p->pManAig;
      pVVar22 = pAVar25->vCos;
      piVar14 = piVar12;
    } while (lVar9 < pVVar22->nSize);
  }
  if ((long)piVar12 - (long)*pCVar10->pClauses >> 2 != lVar16) {
    __assert_fail("pLits - pCnf->pClauses[0] == nLiterals",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                  ,400,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
  }
  if ((long)ppiVar11 - (long)pCVar10->pClauses >> 3 != lVar18) {
    __assert_fail("pClas - pCnf->pClauses == nClauses",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                  ,0x191,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
  }
  return pCVar10;
}

Assistant:

Cnf_Dat_t * Cnf_ManWriteCnf( Cnf_Man_t * p, Vec_Ptr_t * vMapped, int nOutputs )
{
    int fChangeVariableOrder = 0; // should be set to 0 to improve performance
    Aig_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    Cnf_Cut_t * pCut;
    Vec_Int_t * vCover, * vSopTemp;
    int OutVar, PoVar, pVars[32], * pLits, ** pClas;
    unsigned uTruth;
    int i, k, nLiterals, nClauses, Cube, Number;

    // count the number of literals and clauses
    nLiterals = 1 + Aig_ManCoNum( p->pManAig ) + 3 * nOutputs;
    nClauses = 1 + Aig_ManCoNum( p->pManAig ) + nOutputs;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        pCut = Cnf_ObjBestCut( pObj );

        // positive polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            nLiterals += Cnf_SopCountLiterals( p->pSops[uTruth], p->pSopSizes[uTruth] ) + p->pSopSizes[uTruth];
            assert( p->pSopSizes[uTruth] >= 0 );
            nClauses += p->pSopSizes[uTruth];
        }
        else
        {
            nLiterals += Cnf_IsopCountLiterals( pCut->vIsop[1], pCut->nFanins ) + Vec_IntSize(pCut->vIsop[1]);
            nClauses += Vec_IntSize(pCut->vIsop[1]);
        }
        // negative polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & ~*Cnf_CutTruth(pCut);
            nLiterals += Cnf_SopCountLiterals( p->pSops[uTruth], p->pSopSizes[uTruth] ) + p->pSopSizes[uTruth];
            assert( p->pSopSizes[uTruth] >= 0 );
            nClauses += p->pSopSizes[uTruth];
        }
        else
        {
            nLiterals += Cnf_IsopCountLiterals( pCut->vIsop[0], pCut->nFanins ) + Vec_IntSize(pCut->vIsop[0]);
            nClauses += Vec_IntSize(pCut->vIsop[0]);
        }
//printf( "%d ", nClauses-(1 + Aig_ManCoNum( p->pManAig )) );
    }
//printf( "\n" );

    // allocate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = p->pManAig;
    pCnf->nLiterals = nLiterals;
    pCnf->nClauses = nClauses;
    pCnf->pClauses = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;
    // create room for variable numbers
    pCnf->pVarNums = ABC_ALLOC( int, Aig_ManObjNumMax(p->pManAig) );
//    memset( pCnf->pVarNums, 0xff, sizeof(int) * Aig_ManObjNumMax(p->pManAig) );
    for ( i = 0; i < Aig_ManObjNumMax(p->pManAig); i++ )
        pCnf->pVarNums[i] = -1;

    if ( !fChangeVariableOrder )
    {
        // assign variables to the last (nOutputs) POs
        Number = 1;
        if ( nOutputs )
        {
            if ( Aig_ManRegNum(p->pManAig) == 0 )
            {
                assert( nOutputs == Aig_ManCoNum(p->pManAig) );
                Aig_ManForEachCo( p->pManAig, pObj, i )
                    pCnf->pVarNums[pObj->Id] = Number++;
            }
            else
            {
                assert( nOutputs == Aig_ManRegNum(p->pManAig) );
                Aig_ManForEachLiSeq( p->pManAig, pObj, i )
                    pCnf->pVarNums[pObj->Id] = Number++;
            }
        }
        // assign variables to the internal nodes
        Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number++;
        // assign variables to the PIs and constant node
        Aig_ManForEachCi( p->pManAig, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number++;
        pCnf->pVarNums[Aig_ManConst1(p->pManAig)->Id] = Number++;
        pCnf->nVars = Number;
    }
    else
    {
        // assign variables to the last (nOutputs) POs
        Number = Aig_ManObjNumMax(p->pManAig) + 1;
        pCnf->nVars = Number + 1;
        if ( nOutputs )
        {
            if ( Aig_ManRegNum(p->pManAig) == 0 )
            {
                assert( nOutputs == Aig_ManCoNum(p->pManAig) );
                Aig_ManForEachCo( p->pManAig, pObj, i )
                    pCnf->pVarNums[pObj->Id] = Number--;
            }
            else
            {
                assert( nOutputs == Aig_ManRegNum(p->pManAig) );
                Aig_ManForEachLiSeq( p->pManAig, pObj, i )
                    pCnf->pVarNums[pObj->Id] = Number--;
            }
        }
        // assign variables to the internal nodes
        Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number--;
        // assign variables to the PIs and constant node
        Aig_ManForEachCi( p->pManAig, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number--;
        pCnf->pVarNums[Aig_ManConst1(p->pManAig)->Id] = Number--;
        assert( Number >= 0 );
    }

    // assign the clauses
    vSopTemp = Vec_IntAlloc( 1 << 16 );
    pLits = pCnf->pClauses[0];
    pClas = pCnf->pClauses;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        pCut = Cnf_ObjBestCut( pObj );

        // save variables of this cut
        OutVar = pCnf->pVarNums[ pObj->Id ];
        for ( k = 0; k < (int)pCut->nFanins; k++ )
        {
            pVars[k] = pCnf->pVarNums[ pCut->pFanins[k] ];
            assert( pVars[k] <= Aig_ManObjNumMax(p->pManAig) );
        }

        // positive polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vSopTemp );
            vCover = vSopTemp;
        }
        else
            vCover = pCut->vIsop[1];
        Vec_IntForEachEntry( vCover, Cube, k )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar; 
            pLits += Cnf_IsopWriteCube( Cube, pCut->nFanins, pVars, pLits );
        }

        // negative polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & ~*Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vSopTemp );
            vCover = vSopTemp;
        }
        else
            vCover = pCut->vIsop[0];
        Vec_IntForEachEntry( vCover, Cube, k )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar + 1; 
            pLits += Cnf_IsopWriteCube( Cube, pCut->nFanins, pVars, pLits );
        }
    }
    Vec_IntFree( vSopTemp );
 
    // write the constant literal
    OutVar = pCnf->pVarNums[ Aig_ManConst1(p->pManAig)->Id ];
    assert( OutVar <= Aig_ManObjNumMax(p->pManAig) );
    *pClas++ = pLits;
    *pLits++ = 2 * OutVar; 

    // write the output literals
    Aig_ManForEachCo( p->pManAig, pObj, i )
    {
        OutVar = pCnf->pVarNums[ Aig_ObjFanin0(pObj)->Id ];
        if ( i < Aig_ManCoNum(p->pManAig) - nOutputs )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        }
        else
        {
            PoVar = pCnf->pVarNums[ pObj->Id ];
            // first clause
            *pClas++ = pLits;
            *pLits++ = 2 * PoVar; 
            *pLits++ = 2 * OutVar + !Aig_ObjFaninC0(pObj); 
            // second clause
            *pClas++ = pLits;
            *pLits++ = 2 * PoVar + 1; 
            *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        }
    }

    // verify that the correct number of literals and clauses was written
    assert( pLits - pCnf->pClauses[0] == nLiterals );
    assert( pClas - pCnf->pClauses == nClauses );
//Cnf_DataPrint( pCnf, 1 );
    return pCnf;
}